

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<ProString_&,_const_char_(&)[7]>,_QString>,_const_char_(&)[3]>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  ProString *pPVar1;
  QChar *__dest;
  CutResult CVar2;
  char16_t *__src;
  char16_t *pcVar3;
  long lVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar1 = (p->a).a.a;
  lVar4 = (long)pPVar1->m_length;
  if (lVar4 != 0) {
    __dest = *out;
    pcVar3 = (pPVar1->m_string).d.ptr;
    local_40 = (long)pPVar1->m_offset;
    local_48 = lVar4;
    CVar2 = QtPrivate::QContainerImplHelper::mid((pPVar1->m_string).d.size,&local_40,&local_48);
    __src = (char16_t *)0x0;
    if (CVar2 != Null) {
      __src = pcVar3 + local_40;
    }
    memcpy(__dest,__src,lVar4 * 2);
    *out = *out + lVar4;
  }
  QVar5.m_data = *(p->a).a.b;
  QVar5.m_size = 6;
  QAbstractConcatenable::convertFromUtf8(QVar5,out);
  lVar4 = (p->a).b.d.size;
  if (lVar4 != 0) {
    pcVar3 = (p->a).b.d.ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QString::_empty;
    }
    memcpy(*out,pcVar3,lVar4 * 2);
  }
  *out = *out + lVar4;
  QVar6.m_data = *p->b;
  QVar6.m_size = 2;
  QAbstractConcatenable::convertFromUtf8(QVar6,out);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }